

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpztriangle.cpp
# Opt level: O2

void pztopology::TPZTriangle::ComputeHCurlDirections<double>
               (TPZFMatrix<double> *gradx,TPZFMatrix<double> *directions,
               TPZVec<int> *transformationIds)

{
  double dVar1;
  REAL RVar2;
  int iVar3;
  int *piVar4;
  double *pdVar5;
  long lVar6;
  int64_t size;
  long row;
  double dVar7;
  double dVar8;
  double dVar9;
  TPZManVector<double,_3> edgeSign;
  TPZManVector<double,_3> v2;
  TPZManVector<double,_3> v1;
  double local_38;
  
  size = (gradx->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  TPZManVector<double,_3>::TPZManVector(&v1,size);
  TPZManVector<double,_3>::TPZManVector(&v2,size);
  lVar6 = 0;
  if (size < 1) {
    size = lVar6;
  }
  for (; size != lVar6; lVar6 = lVar6 + 1) {
    pdVar5 = TPZFMatrix<double>::operator()(gradx,lVar6,0);
    v1.super_TPZVec<double>.fStore[lVar6] = *pdVar5;
    pdVar5 = TPZFMatrix<double>::operator()(gradx,lVar6,1);
    v2.super_TPZVec<double>.fStore[lVar6] = *pdVar5;
  }
  iVar3 = transformationIds->fStore[3];
  local_38 = 0.0;
  TPZManVector<double,_3>::TPZManVector(&edgeSign,3,&local_38);
  piVar4 = transformationIds->fStore;
  for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
    edgeSign.super_TPZVec<double>.fStore[lVar6] = (double)(int)(-(uint)(piVar4[lVar6] != 0) | 1);
  }
  dVar7 = (double)(int)(-(*(byte *)(piVar4 + 3) & 1) | 1);
  lVar6 = (long)(iVar3 * 2);
  for (row = 0; size != row; row = row + 1) {
    dVar9 = v1.super_TPZVec<double>.fStore[row];
    dVar8 = *edgeSign.super_TPZVec<double>.fStore;
    pdVar5 = TPZFMatrix<double>::operator()(directions,row,0);
    *pdVar5 = dVar9 * dVar8;
    dVar9 = v1.super_TPZVec<double>.fStore[row];
    dVar8 = v2.super_TPZVec<double>.fStore[row];
    dVar1 = *edgeSign.super_TPZVec<double>.fStore;
    pdVar5 = TPZFMatrix<double>::operator()(directions,row,1);
    *pdVar5 = (dVar9 + dVar8) * dVar1;
    dVar9 = v2.super_TPZVec<double>.fStore[row];
    dVar8 = edgeSign.super_TPZVec<double>.fStore[1];
    pdVar5 = TPZFMatrix<double>::operator()(directions,row,2);
    *pdVar5 = (dVar9 * 1.4142135623730951 * dVar8) / 1.4142135623730951;
    dVar9 = v1.super_TPZVec<double>.fStore[row];
    dVar8 = edgeSign.super_TPZVec<double>.fStore[1];
    pdVar5 = TPZFMatrix<double>::operator()(directions,row,3);
    *pdVar5 = (dVar9 * -1.4142135623730951 * dVar8) / 1.4142135623730951;
    dVar9 = v1.super_TPZVec<double>.fStore[row];
    dVar8 = v2.super_TPZVec<double>.fStore[row];
    dVar1 = edgeSign.super_TPZVec<double>.fStore[2];
    pdVar5 = TPZFMatrix<double>::operator()(directions,row,4);
    *pdVar5 = dVar1 * -(dVar9 + dVar8);
    dVar9 = v2.super_TPZVec<double>.fStore[row];
    dVar8 = edgeSign.super_TPZVec<double>.fStore[2];
    pdVar5 = TPZFMatrix<double>::operator()(directions,row,5);
    *pdVar5 = dVar8 * -dVar9;
    dVar9 = v1.super_TPZVec<double>.fStore[row];
    dVar8 = v2.super_TPZVec<double>.fStore[row];
    dVar1 = *edgeSign.super_TPZVec<double>.fStore;
    pdVar5 = TPZFMatrix<double>::operator()(directions,row,6);
    *pdVar5 = (dVar8 * 0.5 + dVar9) * dVar1;
    dVar9 = v1.super_TPZVec<double>.fStore[row];
    dVar8 = v2.super_TPZVec<double>.fStore[row];
    dVar1 = edgeSign.super_TPZVec<double>.fStore[1];
    pdVar5 = TPZFMatrix<double>::operator()(directions,row,7);
    *pdVar5 = ((dVar8 - dVar9) * 0.7071067811865476 * dVar1) / 1.4142135623730951;
    dVar9 = v1.super_TPZVec<double>.fStore[row];
    dVar8 = v2.super_TPZVec<double>.fStore[row];
    dVar1 = edgeSign.super_TPZVec<double>.fStore[2];
    pdVar5 = TPZFMatrix<double>::operator()(directions,row,8);
    *pdVar5 = (dVar9 * -0.5 - dVar8) * dVar1;
    dVar9 = *edgeSign.super_TPZVec<double>.fStore;
    dVar8 = v2.super_TPZVec<double>.fStore[row];
    pdVar5 = TPZFMatrix<double>::operator()(directions,row,9);
    dVar8 = dVar9 * dVar7 * dVar8;
    *pdVar5 = dVar8 + dVar8;
    dVar9 = edgeSign.super_TPZVec<double>.fStore[1];
    dVar8 = v2.super_TPZVec<double>.fStore[row];
    dVar1 = v1.super_TPZVec<double>.fStore[row];
    pdVar5 = TPZFMatrix<double>::operator()(directions,row,10);
    dVar9 = (-dVar8 - dVar1) * dVar9 * dVar7;
    *pdVar5 = dVar9 + dVar9;
    dVar9 = edgeSign.super_TPZVec<double>.fStore[2];
    dVar8 = v1.super_TPZVec<double>.fStore[row];
    pdVar5 = TPZFMatrix<double>::operator()(directions,row,0xb);
    dVar8 = dVar9 * dVar7 * dVar8;
    *pdVar5 = dVar8 + dVar8;
    RVar2 = fTangentVectors[lVar6][row];
    pdVar5 = TPZFMatrix<double>::operator()(directions,row,0xc);
    *pdVar5 = RVar2;
    dVar9 = *(double *)(lVar6 * 0x10 + 0x1300ac0 + row * 8);
    pdVar5 = TPZFMatrix<double>::operator()(directions,row,0xd);
    *pdVar5 = dVar9;
  }
  TPZManVector<double,_3>::~TPZManVector(&edgeSign);
  TPZManVector<double,_3>::~TPZManVector(&v2);
  TPZManVector<double,_3>::~TPZManVector(&v1);
  return;
}

Assistant:

void TPZTriangle::ComputeHCurlDirections(TPZFMatrix<TVar> &gradx, TPZFMatrix<TVar> &directions, const TPZVec<int> &transformationIds)
    {
        const auto dim = gradx.Rows();
        TPZManVector<TVar, 3> v1(dim),v2(dim);
        for (int i=0; i<dim; i++) {
            v1[i] = gradx(i,0);
            v2[i] = gradx(i,1);
        }
        constexpr auto nEdges{3}, nFaces{1};
        constexpr REAL faceArea{TPZTriangle::RefElVolume()};
        constexpr REAL edgeLength[nEdges]{1,M_SQRT2,1};
        const int facePermute = transformationIds[nEdges];
        TPZManVector<REAL,nEdges> edgeSign(nEdges,0);
        for(auto iEdge = 0; iEdge < nEdges; iEdge++){
            edgeSign[iEdge] = transformationIds[iEdge] == 0 ? 1 : -1;
        }
        const int faceOrient =  transformationIds[nEdges] % 2 == 0 ? 1 : -1;

        for (int i=0; i<dim; i++)
        {
            //v^{e,a} constant vector fields associated with edge e and vertex a
            //they are defined in such a way that v^{e,a} is normal to the edge \hat{e}
            //adjacent to edge e by the vertex a. the tangential component is set to be 1 /edgeLength[e]
            directions(i,0) = (v1[i]) * edgeSign[0] / edgeLength[0];
            directions(i,1) = (v1[i]+v2[i]) * edgeSign[0] / edgeLength[0];
            directions(i,2) = (v2[i]*M_SQRT2) * edgeSign[1] / edgeLength[1];
            directions(i,3) = (-v1[i]*M_SQRT2) * edgeSign[1] / edgeLength[1];
            directions(i,4) = (v1[i] + v2[i]) * -1 * edgeSign[2] / edgeLength[2];
            directions(i,5) = (-v2[i]) * edgeSign[2] / edgeLength[2];

            //v^{e,T} constant vector fields associated with edge e and aligned with it
            directions(i,6) = (v1[i]+0.5*v2[i]) * edgeSign[0] / edgeLength[0];
            directions(i,7) = ((-v1[i]+v2[i]) * M_SQRT1_2) * edgeSign[1] / edgeLength[1];
            directions(i,8) = (-0.5*v1[i]-v2[i]) * edgeSign[2] / edgeLength[2];

            //v^{F,e} constant vector fields associated with face F and edge e
            //they are defined in such a way that v^{F,e} is normal to the face \hat{F}
            //adjacent to face F by edge e
            directions(i,9)  = faceOrient * edgeSign[0] *  v2[i] /faceArea;//* edgeLength[0];
            directions(i,10) = faceOrient * edgeSign[1] *  (-v2[i]-v1[i]) /faceArea;//* edgeLength[1];
            directions(i,11) = faceOrient * edgeSign[2] *  v1[i] /faceArea;//* edgeLength[0];

            //v^{F,T} orthonormal vectors associated with face F and tangent to it.
            directions(i,12) = fTangentVectors[2*facePermute][i];
            directions(i,13) = fTangentVectors[2*facePermute + 1][i];
        }
    }